

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiheadattention.cpp
# Opt level: O3

int __thiscall ncnn::MultiHeadAttention::load_model(MultiHeadAttention *this,ModelBin *mb)

{
  int *piVar1;
  void *pvVar2;
  Allocator *pAVar3;
  int iVar4;
  void *local_70;
  int *local_68;
  size_t local_60;
  int local_58;
  Allocator *local_50;
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  int local_38;
  size_t local_30;
  
  (*mb->_vptr_ModelBin[2])(&local_70,mb,(ulong)(uint)this->weight_data_size,0);
  if (&this->q_weight_data != (Mat *)&local_70) {
    if (local_68 != (int *)0x0) {
      LOCK();
      *local_68 = *local_68 + 1;
      UNLOCK();
    }
    piVar1 = (this->q_weight_data).refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        pvVar2 = (this->q_weight_data).data;
        pAVar3 = (this->q_weight_data).allocator;
        if (pAVar3 == (Allocator *)0x0) {
          if (pvVar2 != (void *)0x0) {
            free(pvVar2);
          }
        }
        else {
          (*pAVar3->_vptr_Allocator[3])();
        }
      }
    }
    (this->q_weight_data).data = local_70;
    (this->q_weight_data).refcount = local_68;
    (this->q_weight_data).elemsize = local_60;
    (this->q_weight_data).elempack = local_58;
    (this->q_weight_data).allocator = local_50;
    (this->q_weight_data).dims = local_48;
    (this->q_weight_data).w = iStack_44;
    (this->q_weight_data).h = iStack_40;
    (this->q_weight_data).d = iStack_3c;
    (this->q_weight_data).c = local_38;
    (this->q_weight_data).cstep = local_30;
  }
  if (local_68 != (int *)0x0) {
    LOCK();
    *local_68 = *local_68 + -1;
    UNLOCK();
    if (*local_68 == 0) {
      if (local_50 == (Allocator *)0x0) {
        if (local_70 != (void *)0x0) {
          free(local_70);
        }
      }
      else {
        (*local_50->_vptr_Allocator[3])();
      }
    }
  }
  iVar4 = -100;
  if (((this->q_weight_data).data != (void *)0x0) &&
     ((long)(this->q_weight_data).c * (this->q_weight_data).cstep != 0)) {
    (*mb->_vptr_ModelBin[2])(&local_70,mb,(ulong)(uint)this->embed_dim,1);
    if (&this->q_bias_data != (Mat *)&local_70) {
      if (local_68 != (int *)0x0) {
        LOCK();
        *local_68 = *local_68 + 1;
        UNLOCK();
      }
      piVar1 = (this->q_bias_data).refcount;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          pvVar2 = (this->q_bias_data).data;
          pAVar3 = (this->q_bias_data).allocator;
          if (pAVar3 == (Allocator *)0x0) {
            if (pvVar2 != (void *)0x0) {
              free(pvVar2);
            }
          }
          else {
            (*pAVar3->_vptr_Allocator[3])();
          }
        }
      }
      (this->q_bias_data).data = local_70;
      (this->q_bias_data).refcount = local_68;
      (this->q_bias_data).elemsize = local_60;
      (this->q_bias_data).elempack = local_58;
      (this->q_bias_data).allocator = local_50;
      (this->q_bias_data).dims = local_48;
      (this->q_bias_data).w = iStack_44;
      (this->q_bias_data).h = iStack_40;
      (this->q_bias_data).d = iStack_3c;
      (this->q_bias_data).c = local_38;
      (this->q_bias_data).cstep = local_30;
    }
    if (local_68 != (int *)0x0) {
      LOCK();
      *local_68 = *local_68 + -1;
      UNLOCK();
      if (*local_68 == 0) {
        if (local_50 == (Allocator *)0x0) {
          if (local_70 != (void *)0x0) {
            free(local_70);
          }
        }
        else {
          (*local_50->_vptr_Allocator[3])();
        }
      }
    }
    if (((this->q_bias_data).data != (void *)0x0) &&
       ((long)(this->q_bias_data).c * (this->q_bias_data).cstep != 0)) {
      (*mb->_vptr_ModelBin[2])(&local_70,mb,(ulong)(uint)this->weight_data_size,0);
      if (&this->k_weight_data != (Mat *)&local_70) {
        if (local_68 != (int *)0x0) {
          LOCK();
          *local_68 = *local_68 + 1;
          UNLOCK();
        }
        piVar1 = (this->k_weight_data).refcount;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            pvVar2 = (this->k_weight_data).data;
            pAVar3 = (this->k_weight_data).allocator;
            if (pAVar3 == (Allocator *)0x0) {
              if (pvVar2 != (void *)0x0) {
                free(pvVar2);
              }
            }
            else {
              (*pAVar3->_vptr_Allocator[3])();
            }
          }
        }
        (this->k_weight_data).data = local_70;
        (this->k_weight_data).refcount = local_68;
        (this->k_weight_data).elemsize = local_60;
        (this->k_weight_data).elempack = local_58;
        (this->k_weight_data).allocator = local_50;
        (this->k_weight_data).dims = local_48;
        (this->k_weight_data).w = iStack_44;
        (this->k_weight_data).h = iStack_40;
        (this->k_weight_data).d = iStack_3c;
        (this->k_weight_data).c = local_38;
        (this->k_weight_data).cstep = local_30;
      }
      if (local_68 != (int *)0x0) {
        LOCK();
        *local_68 = *local_68 + -1;
        UNLOCK();
        if (*local_68 == 0) {
          if (local_50 == (Allocator *)0x0) {
            if (local_70 != (void *)0x0) {
              free(local_70);
            }
          }
          else {
            (*local_50->_vptr_Allocator[3])();
          }
        }
      }
      if (((this->k_weight_data).data != (void *)0x0) &&
         ((long)(this->k_weight_data).c * (this->k_weight_data).cstep != 0)) {
        (*mb->_vptr_ModelBin[2])(&local_70,mb,(ulong)(uint)this->embed_dim,1);
        if (&this->k_bias_data != (Mat *)&local_70) {
          if (local_68 != (int *)0x0) {
            LOCK();
            *local_68 = *local_68 + 1;
            UNLOCK();
          }
          piVar1 = (this->k_bias_data).refcount;
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              pvVar2 = (this->k_bias_data).data;
              pAVar3 = (this->k_bias_data).allocator;
              if (pAVar3 == (Allocator *)0x0) {
                if (pvVar2 != (void *)0x0) {
                  free(pvVar2);
                }
              }
              else {
                (*pAVar3->_vptr_Allocator[3])();
              }
            }
          }
          (this->k_bias_data).data = local_70;
          (this->k_bias_data).refcount = local_68;
          (this->k_bias_data).elemsize = local_60;
          (this->k_bias_data).elempack = local_58;
          (this->k_bias_data).allocator = local_50;
          (this->k_bias_data).dims = local_48;
          (this->k_bias_data).w = iStack_44;
          (this->k_bias_data).h = iStack_40;
          (this->k_bias_data).d = iStack_3c;
          (this->k_bias_data).c = local_38;
          (this->k_bias_data).cstep = local_30;
        }
        if (local_68 != (int *)0x0) {
          LOCK();
          *local_68 = *local_68 + -1;
          UNLOCK();
          if (*local_68 == 0) {
            if (local_50 == (Allocator *)0x0) {
              if (local_70 != (void *)0x0) {
                free(local_70);
              }
            }
            else {
              (*local_50->_vptr_Allocator[3])();
            }
          }
        }
        if (((this->k_bias_data).data != (void *)0x0) &&
           ((long)(this->k_bias_data).c * (this->k_bias_data).cstep != 0)) {
          (*mb->_vptr_ModelBin[2])(&local_70,mb,(ulong)(uint)this->weight_data_size,0);
          if (&this->v_weight_data != (Mat *)&local_70) {
            if (local_68 != (int *)0x0) {
              LOCK();
              *local_68 = *local_68 + 1;
              UNLOCK();
            }
            piVar1 = (this->v_weight_data).refcount;
            if (piVar1 != (int *)0x0) {
              LOCK();
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if (*piVar1 == 0) {
                pvVar2 = (this->v_weight_data).data;
                pAVar3 = (this->v_weight_data).allocator;
                if (pAVar3 == (Allocator *)0x0) {
                  if (pvVar2 != (void *)0x0) {
                    free(pvVar2);
                  }
                }
                else {
                  (*pAVar3->_vptr_Allocator[3])();
                }
              }
            }
            (this->v_weight_data).data = local_70;
            (this->v_weight_data).refcount = local_68;
            (this->v_weight_data).elemsize = local_60;
            (this->v_weight_data).elempack = local_58;
            (this->v_weight_data).allocator = local_50;
            (this->v_weight_data).dims = local_48;
            (this->v_weight_data).w = iStack_44;
            (this->v_weight_data).h = iStack_40;
            (this->v_weight_data).d = iStack_3c;
            (this->v_weight_data).c = local_38;
            (this->v_weight_data).cstep = local_30;
          }
          if (local_68 != (int *)0x0) {
            LOCK();
            *local_68 = *local_68 + -1;
            UNLOCK();
            if (*local_68 == 0) {
              if (local_50 == (Allocator *)0x0) {
                if (local_70 != (void *)0x0) {
                  free(local_70);
                }
              }
              else {
                (*local_50->_vptr_Allocator[3])();
              }
            }
          }
          if (((this->v_weight_data).data != (void *)0x0) &&
             ((long)(this->v_weight_data).c * (this->v_weight_data).cstep != 0)) {
            (*mb->_vptr_ModelBin[2])(&local_70,mb,(ulong)(uint)this->embed_dim,1);
            if (&this->v_bias_data != (Mat *)&local_70) {
              if (local_68 != (int *)0x0) {
                LOCK();
                *local_68 = *local_68 + 1;
                UNLOCK();
              }
              piVar1 = (this->v_bias_data).refcount;
              if (piVar1 != (int *)0x0) {
                LOCK();
                *piVar1 = *piVar1 + -1;
                UNLOCK();
                if (*piVar1 == 0) {
                  pvVar2 = (this->v_bias_data).data;
                  pAVar3 = (this->v_bias_data).allocator;
                  if (pAVar3 == (Allocator *)0x0) {
                    if (pvVar2 != (void *)0x0) {
                      free(pvVar2);
                    }
                  }
                  else {
                    (*pAVar3->_vptr_Allocator[3])();
                  }
                }
              }
              (this->v_bias_data).data = local_70;
              (this->v_bias_data).refcount = local_68;
              (this->v_bias_data).elemsize = local_60;
              (this->v_bias_data).elempack = local_58;
              (this->v_bias_data).allocator = local_50;
              (this->v_bias_data).dims = local_48;
              (this->v_bias_data).w = iStack_44;
              (this->v_bias_data).h = iStack_40;
              (this->v_bias_data).d = iStack_3c;
              (this->v_bias_data).c = local_38;
              (this->v_bias_data).cstep = local_30;
            }
            if (local_68 != (int *)0x0) {
              LOCK();
              *local_68 = *local_68 + -1;
              UNLOCK();
              if (*local_68 == 0) {
                if (local_50 == (Allocator *)0x0) {
                  if (local_70 != (void *)0x0) {
                    free(local_70);
                  }
                }
                else {
                  (*local_50->_vptr_Allocator[3])();
                }
              }
            }
            if (((this->v_bias_data).data != (void *)0x0) &&
               ((long)(this->v_bias_data).c * (this->v_bias_data).cstep != 0)) {
              (*mb->_vptr_ModelBin[2])(&local_70,mb,(ulong)(uint)this->weight_data_size,0);
              if (&this->out_weight_data != (Mat *)&local_70) {
                if (local_68 != (int *)0x0) {
                  LOCK();
                  *local_68 = *local_68 + 1;
                  UNLOCK();
                }
                piVar1 = (this->out_weight_data).refcount;
                if (piVar1 != (int *)0x0) {
                  LOCK();
                  *piVar1 = *piVar1 + -1;
                  UNLOCK();
                  if (*piVar1 == 0) {
                    pvVar2 = (this->out_weight_data).data;
                    pAVar3 = (this->out_weight_data).allocator;
                    if (pAVar3 == (Allocator *)0x0) {
                      if (pvVar2 != (void *)0x0) {
                        free(pvVar2);
                      }
                    }
                    else {
                      (*pAVar3->_vptr_Allocator[3])();
                    }
                  }
                }
                (this->out_weight_data).data = local_70;
                (this->out_weight_data).refcount = local_68;
                (this->out_weight_data).elemsize = local_60;
                (this->out_weight_data).elempack = local_58;
                (this->out_weight_data).allocator = local_50;
                (this->out_weight_data).dims = local_48;
                (this->out_weight_data).w = iStack_44;
                (this->out_weight_data).h = iStack_40;
                (this->out_weight_data).d = iStack_3c;
                (this->out_weight_data).c = local_38;
                (this->out_weight_data).cstep = local_30;
              }
              if (local_68 != (int *)0x0) {
                LOCK();
                *local_68 = *local_68 + -1;
                UNLOCK();
                if (*local_68 == 0) {
                  if (local_50 == (Allocator *)0x0) {
                    if (local_70 != (void *)0x0) {
                      free(local_70);
                    }
                  }
                  else {
                    (*local_50->_vptr_Allocator[3])();
                  }
                }
              }
              if (((this->out_weight_data).data != (void *)0x0) &&
                 ((long)(this->out_weight_data).c * (this->out_weight_data).cstep != 0)) {
                (*mb->_vptr_ModelBin[2])(&local_70,mb,(ulong)(uint)this->embed_dim,1);
                if (&this->out_bias_data != (Mat *)&local_70) {
                  if (local_68 != (int *)0x0) {
                    LOCK();
                    *local_68 = *local_68 + 1;
                    UNLOCK();
                  }
                  piVar1 = (this->out_bias_data).refcount;
                  if (piVar1 != (int *)0x0) {
                    LOCK();
                    *piVar1 = *piVar1 + -1;
                    UNLOCK();
                    if (*piVar1 == 0) {
                      pvVar2 = (this->out_bias_data).data;
                      pAVar3 = (this->out_bias_data).allocator;
                      if (pAVar3 == (Allocator *)0x0) {
                        if (pvVar2 != (void *)0x0) {
                          free(pvVar2);
                        }
                      }
                      else {
                        (*pAVar3->_vptr_Allocator[3])();
                      }
                    }
                  }
                  (this->out_bias_data).data = local_70;
                  (this->out_bias_data).refcount = local_68;
                  (this->out_bias_data).elemsize = local_60;
                  (this->out_bias_data).elempack = local_58;
                  (this->out_bias_data).allocator = local_50;
                  (this->out_bias_data).dims = local_48;
                  (this->out_bias_data).w = iStack_44;
                  (this->out_bias_data).h = iStack_40;
                  (this->out_bias_data).d = iStack_3c;
                  (this->out_bias_data).c = local_38;
                  (this->out_bias_data).cstep = local_30;
                }
                if (local_68 != (int *)0x0) {
                  LOCK();
                  *local_68 = *local_68 + -1;
                  UNLOCK();
                  if (*local_68 == 0) {
                    if (local_50 == (Allocator *)0x0) {
                      if (local_70 != (void *)0x0) {
                        free(local_70);
                      }
                    }
                    else {
                      (*local_50->_vptr_Allocator[3])();
                    }
                  }
                }
                if (((this->out_bias_data).data == (void *)0x0) ||
                   (iVar4 = 0, (long)(this->out_bias_data).c * (this->out_bias_data).cstep == 0)) {
                  iVar4 = -100;
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int MultiHeadAttention::load_model(const ModelBin& mb)
{
    q_weight_data = mb.load(weight_data_size, 0);
    if (q_weight_data.empty())
        return -100;

    q_bias_data = mb.load(embed_dim, 1);
    if (q_bias_data.empty())
        return -100;

    k_weight_data = mb.load(weight_data_size, 0);
    if (k_weight_data.empty())
        return -100;

    k_bias_data = mb.load(embed_dim, 1);
    if (k_bias_data.empty())
        return -100;

    v_weight_data = mb.load(weight_data_size, 0);
    if (v_weight_data.empty())
        return -100;

    v_bias_data = mb.load(embed_dim, 1);
    if (v_bias_data.empty())
        return -100;

    out_weight_data = mb.load(weight_data_size, 0);
    if (out_weight_data.empty())
        return -100;

    out_bias_data = mb.load(embed_dim, 1);
    if (out_bias_data.empty())
        return -100;

    return 0;
}